

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O3

Node * hashkey(GCtab *t,cTValue *key)

{
  anon_struct_8_2_f9ee98fb_for_u32 aVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  aVar1 = key->u32;
  uVar5 = (long)aVar1 >> 0x2f;
  if (uVar5 == 0xfffffffffffffffb) {
    uVar2 = t->hmask & *(uint *)(((ulong)aVar1 & 0x7fffffffffff) + 0xc);
  }
  else {
    uVar2 = aVar1.hi;
    if (uVar5 < 0xfffffffffffffff2) {
      uVar4 = uVar2 * 2;
      uVar3 = (aVar1.lo ^ uVar4) - (uVar2 << 0xf | uVar4 >> 0x12);
      uVar2 = ((uVar2 << 0x14 | uVar4 >> 0xd) ^ uVar3) - (uVar3 * 0x2000 | uVar3 >> 0x13);
    }
    else if (uVar5 + 3 < 2) {
      uVar2 = -((int)uVar2 >> 0xf) - 2;
    }
    else {
      uVar4 = (uVar2 ^ aVar1.lo) - (uVar2 << 0xe | uVar2 >> 0x12);
      uVar2 = ((uVar2 << 0x13 | uVar2 >> 0xd) ^ uVar4) - (uVar4 * 0x2000 | uVar4 >> 0x13);
    }
    uVar2 = uVar2 & t->hmask;
  }
  return (Node *)((ulong)uVar2 * 0x18 + (t->node).ptr64);
}

Assistant:

static Node *hashkey(const GCtab *t, cTValue *key)
{
  lj_assertX(!tvisint(key), "attempt to hash integer");
  if (tvisstr(key))
    return hashstr(t, strV(key));
  else if (tvisnum(key))
    return hashnum(t, key);
  else if (tvisbool(key))
    return hashmask(t, boolV(key));
  else
    return hashgcref(t, key->gcr);
  /* Only hash 32 bits of lightuserdata on a 64 bit CPU. Good enough? */
}